

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

int lest::repeat(text *opt,text *arg)

{
  pointer pcVar1;
  long lVar2;
  runtime_error *this;
  runtime_error local_e0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  char *local_50 [2];
  char local_40 [16];
  
  pcVar1 = (arg->_M_dataplus)._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar1,pcVar1 + arg->_M_string_length);
  lVar2 = strtol(local_50[0],(char **)0x0,10);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  if (-2 < (int)lVar2) {
    return (int)lVar2;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_d0,"expecting \'-1\' or positive number with option \'",opt);
  std::operator+(&local_b0,&local_d0,"\', got \'");
  std::operator+(&local_90,&local_b0,arg);
  std::operator+(&local_70,&local_90,"\' (try option --help)");
  std::runtime_error::runtime_error(local_e0,(string *)&local_70);
  std::runtime_error::runtime_error(this,local_e0);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline int repeat( text opt, text arg )
{
    const int num = lest::stoi( arg );

    if ( indefinite( num ) || num >= 0 )
        return num;

    throw std::runtime_error( "expecting '-1' or positive number with option '" + opt + "', got '" + arg + "' (try option --help)" );
}